

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprpc.cpp
# Opt level: O1

bool __thiscall
mprpc::MpRpcServer::send_rsp
          (MpRpcServer *this,shared_ptr<mprpc::ClientConnection> *conn,
          shared_ptr<mprpc::MpRpcMessage> *req,void *data,size_t size)

{
  uint uVar1;
  undefined2 uVar2;
  char *pcVar3;
  long lVar4;
  ssize_t sVar5;
  uint16_t val;
  ushort uVar6;
  MsgPackPacker *this_00;
  int __flags;
  uchar d;
  MsgPackPacker pk;
  char local_7d;
  uint local_7c;
  MsgPackPacker local_78;
  uint local_44;
  element_type *local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  __flags = (int)size;
  local_78.pk.data = &local_78;
  local_78.sb.size = 0;
  local_78.sb.data = (char *)0x0;
  local_78.sb.alloc = 0;
  local_78.pk.callback = msgpack_sbuffer_write;
  pcVar3 = (char *)realloc((void *)0x0,0x2000);
  if (pcVar3 != (char *)0x0) {
    pcVar3[local_78.sb.size] = -0x7c;
    local_78.sb.size = local_78.sb.size + 1;
    local_78.sb.data = pcVar3;
    local_78.sb.alloc = 0x2000;
  }
  uVar1 = ((req->super___shared_ptr<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->id;
  local_7d = -0x5e;
  (*local_78.pk.callback)(local_78.pk.data,&local_7d,1);
  (*local_78.pk.callback)(local_78.pk.data,"id",2);
  uVar6 = (ushort)uVar1;
  uVar2 = local_7c._2_2_;
  local_44._0_1_ = (undefined1)uVar1;
  local_44 = uVar1;
  if ((int)uVar1 < -0x20) {
    if ((int)uVar1 < -0x8000) {
      local_7d = -0x2e;
      local_7c = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
      (*local_78.pk.callback)(local_78.pk.data,&local_7d,5);
    }
    else if ((int)uVar1 < -0x80) {
      local_7d = -0x2f;
      local_7c = CONCAT22(uVar2,uVar6 << 8 | uVar6 >> 8);
      (*local_78.pk.callback)(local_78.pk.data,&local_7d,3);
    }
    else {
      local_7d = -0x30;
      local_7c = CONCAT31(local_7c._1_3_,(undefined1)local_44);
      (*local_78.pk.callback)(local_78.pk.data,&local_7d,2);
    }
  }
  else if ((int)uVar1 < 0x80) {
    (*local_78.pk.callback)(local_78.pk.data,(char *)&local_44,1);
  }
  else if ((int)uVar1 < 0x100) {
    local_7d = -0x34;
    local_7c = CONCAT31(local_7c._1_3_,(undefined1)local_44);
    (*local_78.pk.callback)(local_78.pk.data,&local_7d,2);
  }
  else if ((int)uVar1 < 0x10000) {
    local_7d = -0x33;
    local_7c = CONCAT22(uVar2,uVar6 << 8 | uVar6 >> 8);
    (*local_78.pk.callback)(local_78.pk.data,&local_7d,3);
  }
  else {
    local_7d = -0x32;
    local_7c = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    (*local_78.pk.callback)(local_78.pk.data,&local_7d,5);
  }
  MsgPackPacker::pack_map_item
            (&local_78,"method",
             &((req->super___shared_ptr<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              method);
  local_7d = -0x5a;
  (*local_78.pk.callback)(local_78.pk.data,&local_7d,1);
  (*local_78.pk.callback)(local_78.pk.data,"result",6);
  (*local_78.pk.callback)(local_78.pk.data,(char *)data,size);
  local_7d = -0x5b;
  (*local_78.pk.callback)(local_78.pk.data,&local_7d,1);
  (*local_78.pk.callback)(local_78.pk.data,"debug",5);
  local_7d = -0x7e;
  (*local_78.pk.callback)(local_78.pk.data,&local_7d,1);
  MsgPackPacker::pack_map_item
            (&local_78,"recv_time",
             (((req->super___shared_ptr<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
             recv_time).__d.__r / 1000);
  lVar4 = std::chrono::_V2::system_clock::now();
  this_00 = &local_78;
  MsgPackPacker::pack_map_item(this_00,"send_time",lVar4 / 1000);
  local_40 = (conn->super___shared_ptr<mprpc::ClientConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_38 = (conn->super___shared_ptr<mprpc::ClientConnection,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_38->_M_use_count = local_38->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_38->_M_use_count = local_38->_M_use_count + 1;
    }
  }
  sVar5 = send((MpRpcServer *)this_00,(int)&local_40,local_78.sb.data,local_78.sb.size,__flags);
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  free(local_78.sb.data);
  return (bool)(char)sVar5;
}

Assistant:

bool MpRpcServer::send_rsp(shared_ptr<mprpc::ClientConnection> conn,
        shared_ptr<mprpc::MpRpcMessage> req,
        const void* data,
        size_t size)
    {
        MsgPackPacker pk;

        pk.pack_map(4);
        pk.pack_map_item("id", req->id);
        pk.pack_map_item("method", req->method);
        pk.pack_string("result");
        msgpack_pack_str_body(&pk.pk, data, size);

        pk.pack_string("debug");
        pk.pack_map(2);
        pk.pack_map_item("recv_time", (uint64_t)time_point_cast<microseconds>(req->recv_time).time_since_epoch().count());
        pk.pack_map_item("send_time", (uint64_t)time_point_cast<microseconds>(system_clock::now()).time_since_epoch().count());

        return send(conn, pk.sb.data, pk.sb.size);
    }